

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.cpp
# Opt level: O0

void __thiscall fineftp::Filesystem::FileStatus::FileStatus(FileStatus *this,string *path)

{
  int iVar1;
  char *__file;
  int error_code;
  string *path_local;
  FileStatus *this_local;
  
  ::std::__cxx11::string::string((string *)this,(string *)path);
  __file = (char *)::std::__cxx11::string::c_str();
  iVar1 = stat(__file,(stat *)&this->file_status_);
  this->is_ok_ = iVar1 == 0;
  return;
}

Assistant:

FileStatus::FileStatus(const std::string& path)
    : path_(path)
  {
#ifdef WIN32
    std::wstring w_path_ = StrConvert::Utf8ToWide(path);
    const int error_code = _wstat64(w_path_.c_str(), &file_status_);
#else // WIN32
    const int error_code = stat(path.c_str(), &file_status_);
#endif // WIN32
    is_ok_ = (error_code == 0);
  }